

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_pi_iterator_t *
pi_initialise_encode(opj_image_t *image,opj_cp_t *cp,int tileno,J2K_T2_MODE t2_mode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  undefined4 uVar7;
  opj_tcp_t *poVar8;
  opj_tccp_t *poVar9;
  opj_image_comp_t *poVar10;
  undefined4 uVar11;
  int iVar12;
  OPJ_UINT32 OVar13;
  int iVar14;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar15;
  ulong uVar16;
  opj_pi_resolution_t *poVar17;
  ulong uVar18;
  short *psVar19;
  byte bVar20;
  byte bVar21;
  int iVar22;
  OPJ_UINT32 OVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  OPJ_UINT32 OVar31;
  int iVar32;
  OPJ_UINT32 OVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  uint local_fc;
  long local_88;
  
  poVar8 = cp->tcps;
  iVar1 = poVar8[tileno].numpocs;
  pi = (opj_pi_iterator_t *)calloc((long)iVar1 + 1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_00128fb5:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else {
    pi->tp_on = cp->tp_on;
    iVar35 = 0;
    local_fc = 0;
    for (lVar26 = 0; lVar26 <= iVar1; lVar26 = lVar26 + 1) {
      iVar12 = tileno / cp->tw;
      iVar22 = tileno % cp->tw;
      iVar14 = cp->tx0;
      iVar32 = cp->tdx;
      OVar31 = iVar32 * iVar22 + iVar14;
      if ((int)OVar31 <= (int)image->x0) {
        OVar31 = image->x0;
      }
      pi[lVar26].tx0 = OVar31;
      iVar29 = cp->ty0;
      iVar2 = cp->tdy;
      OVar33 = iVar2 * iVar12 + iVar29;
      if ((int)OVar33 <= (int)image->y0) {
        OVar33 = image->y0;
      }
      pi[lVar26].ty0 = OVar33;
      OVar23 = (iVar22 + 1) * iVar32 + iVar14;
      if ((int)image->x1 <= (int)OVar23) {
        OVar23 = image->x1;
      }
      pi[lVar26].tx1 = OVar23;
      OVar13 = (iVar12 + 1) * iVar2 + iVar29;
      if ((int)image->y1 <= (int)OVar13) {
        OVar13 = image->y1;
      }
      pi[lVar26].ty1 = OVar13;
      uVar3 = image->numcomps;
      pi[lVar26].numcomps = uVar3;
      poVar15 = (opj_pi_comp_t *)calloc((ulong)uVar3,0x18);
      pi[lVar26].comps = poVar15;
      if (poVar15 == (opj_pi_comp_t *)0x0) {
LAB_00128fa7:
        pi_destroy(pi,cp,tileno);
        goto LAB_00128fb5;
      }
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      local_88 = 0x3b0;
      for (uVar25 = 0; uVar25 != uVar16; uVar25 = uVar25 + 1) {
        poVar9 = poVar8[tileno].tccps;
        poVar10 = image->comps;
        OVar4 = poVar10[uVar25].dx;
        poVar15[uVar25].dx = OVar4;
        OVar5 = poVar10[uVar25].dy;
        poVar15[uVar25].dy = OVar5;
        uVar6 = poVar9[uVar25].numresolutions;
        poVar15[uVar25].numresolutions = uVar6;
        poVar17 = (opj_pi_resolution_t *)malloc((long)(int)uVar6 << 4);
        poVar15[uVar25].resolutions = poVar17;
        if (poVar17 == (opj_pi_resolution_t *)0x0) goto LAB_00128fa7;
        uVar18 = 0;
        if (0 < (int)uVar6) {
          uVar18 = (ulong)uVar6;
        }
        uVar24 = uVar6;
        for (lVar37 = 0; uVar24 = uVar24 - 1, uVar18 << 2 != lVar37; lVar37 = lVar37 + 4) {
          if ((poVar9[uVar25].csty & 1) == 0) {
            (&poVar17->pdx)[lVar37] = 0xf;
            iVar32 = 0xf;
            iVar14 = 0xf;
          }
          else {
            iVar14 = *(int *)((long)poVar9 + lVar37 + local_88 + -0x84);
            (&poVar17->pdx)[lVar37] = iVar14;
            iVar32 = *(int *)((long)poVar9->stepsizes + lVar37 + local_88 + -0x1c);
          }
          bVar20 = (byte)uVar24;
          iVar12 = 1 << (bVar20 & 0x1f);
          uVar27 = (int)(OVar31 + OVar4 + -1) / (int)OVar4 + -1 + iVar12 >> (bVar20 & 0x1f);
          uVar28 = (int)(OVar33 + OVar5 + -1) / (int)OVar5 + -1 + iVar12 >> (bVar20 & 0x1f);
          uVar30 = (int)(OVar23 + OVar4 + -1) / (int)OVar4 + -1 + iVar12 >> (bVar20 & 0x1f);
          uVar34 = iVar12 + (int)(OVar13 + OVar5 + -1) / (int)OVar5 + -1 >> (bVar20 & 0x1f);
          bVar20 = (byte)iVar32;
          uVar38 = -1 << (bVar20 & 0x1f);
          bVar21 = (byte)iVar14;
          uVar36 = -1 << (bVar21 & 0x1f);
          iVar14 = (int)((((1 << (bVar21 & 0x1f)) + uVar30) - 1 & uVar36) - (uVar36 & uVar27)) >>
                   (bVar21 & 0x1f);
          if (uVar27 == uVar30) {
            iVar14 = 0;
          }
          (&poVar17->pdy)[lVar37] = iVar32;
          iVar32 = (int)((((1 << (bVar20 & 0x1f)) + uVar34) - 1 & uVar38) - (uVar38 & uVar28)) >>
                   (bVar20 & 0x1f);
          if (uVar28 == uVar34) {
            iVar32 = 0;
          }
          (&poVar17->pw)[lVar37] = iVar14;
          (&poVar17->ph)[lVar37] = iVar32;
          if (iVar35 < iVar32 * iVar14) {
            iVar35 = iVar32 * iVar14;
          }
        }
        if ((int)local_fc < (int)uVar6) {
          local_fc = uVar6;
        }
        local_88 = local_88 + 0x438;
      }
      pi[lVar26].step_p = 1;
      pi[lVar26].step_c = iVar35;
      pi[lVar26].step_r = uVar3 * iVar35;
      iVar14 = uVar3 * iVar35 * local_fc;
      pi[lVar26].step_l = iVar14;
      uVar6 = pi->numcomps;
      if (pi->numcomps < 1) {
        uVar6 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
        uVar24 = pi->comps[uVar16].numresolutions;
        uVar25 = 0;
        if (0 < (int)uVar24) {
          uVar25 = (ulong)uVar24;
        }
        poVar15 = pi->comps + uVar16;
        for (lVar37 = 0; uVar24 = uVar24 - 1, uVar25 * 0x10 != lVar37; lVar37 = lVar37 + 0x10) {
          iVar22 = poVar15->dx <<
                   ((char)*(undefined4 *)((long)&poVar15->resolutions->pdx + lVar37) + (char)uVar24
                   & 0x1fU);
          iVar29 = poVar15->dy <<
                   ((char)*(undefined4 *)((long)&poVar15->resolutions->pdy + lVar37) + (char)uVar24
                   & 0x1fU);
          iVar32 = pi->dx;
          iVar12 = iVar22;
          if (iVar32 < iVar22) {
            iVar12 = iVar32;
          }
          if (iVar32 == 0) {
            iVar12 = iVar22;
          }
          pi[lVar26].dx = iVar12;
          iVar32 = pi->dy;
          iVar12 = iVar29;
          if (iVar32 < iVar29) {
            iVar12 = iVar32;
          }
          if (iVar32 == 0) {
            iVar12 = iVar29;
          }
          pi[lVar26].dy = iVar12;
        }
      }
      if (lVar26 == 0) {
        psVar19 = (short *)calloc((long)iVar14 * (long)poVar8[tileno].numlayers,2);
        pi->include = psVar19;
        if (psVar19 == (short *)0x0) goto LAB_00128fa7;
      }
      else {
        pi[lVar26].include = pi[lVar26 + -1].include;
      }
      if ((poVar8[tileno].POC == 0) || ((t2_mode != FINAL_PASS && (cp->cinema == OFF)))) {
        poVar8[tileno].pocs[lVar26].compS = 0;
        poVar8[tileno].pocs[lVar26].compE = uVar3;
        poVar8[tileno].pocs[lVar26].resE = local_fc;
        poVar8[tileno].pocs[lVar26].layS = 0;
        poVar8[tileno].pocs[lVar26].resS = 0;
        poVar8[tileno].pocs[lVar26].layE = poVar8[tileno].numlayers;
        poVar8[tileno].pocs[lVar26].prg = poVar8[tileno].prg;
      }
      else {
        poVar8[tileno].pocs[lVar26].compE = poVar8[tileno].pocs[lVar26].compno1;
        OVar4 = poVar8[tileno].pocs[lVar26].compno0;
        uVar7 = poVar8[tileno].pocs[lVar26].layno1;
        uVar11 = poVar8[tileno].pocs[lVar26].resno1;
        poVar8[tileno].pocs[lVar26].resS = poVar8[tileno].pocs[lVar26].resno0;
        poVar8[tileno].pocs[lVar26].compS = OVar4;
        poVar8[tileno].pocs[lVar26].layE = uVar7;
        poVar8[tileno].pocs[lVar26].resE = uVar11;
        poVar8[tileno].pocs[lVar26].prg = poVar8[tileno].pocs[lVar26].prg1;
        if (lVar26 != 0) {
          iVar14 = poVar8[tileno].pocs[lVar26 + -1].layE;
          if ((int)uVar7 <= iVar14) {
            iVar14 = 0;
          }
          poVar8[tileno].pocs[lVar26].layS = iVar14;
        }
      }
      poVar8[tileno].pocs[lVar26].prcS = 0;
      poVar8[tileno].pocs[lVar26].prcE = iVar35;
      poVar8[tileno].pocs[lVar26].txS = OVar31;
      poVar8[tileno].pocs[lVar26].txE = OVar23;
      poVar8[tileno].pocs[lVar26].tyS = OVar33;
      poVar8[tileno].pocs[lVar26].tyE = OVar13;
      iVar14 = pi[lVar26].dy;
      poVar8[tileno].pocs[lVar26].dx = pi[lVar26].dx;
      poVar8[tileno].pocs[lVar26].dy = iVar14;
    }
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_initialise_encode(opj_image_t *image, opj_cp_t *cp, int tileno, J2K_T2_MODE t2_mode){ 
	int p, q, pino;
	int compno, resno;
	int maxres = 0;
	int maxprec = 0;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;
	
	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {	return NULL;}
	pi->tp_on = cp->tp_on;

	for(pino = 0;pino < tcp->numpocs+1 ; pino ++){
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;
		
		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi[pino].numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_malloc(comp->numresolutions * sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi[pino].tx0, comp->dx);
			tcy0 = int_ceildiv(pi[pino].ty0, comp->dy);
			tcx1 = int_ceildiv(pi[pino].tx1, comp->dx);
			tcy1 = int_ceildiv(pi[pino].ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);

				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw * res->ph;
				}
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			opj_pi_comp_t *comp = &pi->comps[compno];
			for (resno = 0; resno < comp->numresolutions; resno++) {
				int dx, dy;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				dx = comp->dx * (1 << (res->pdx + comp->numresolutions - 1 - resno));
				dy = comp->dy * (1 << (res->pdy + comp->numresolutions - 1 - resno));
				pi[pino].dx = !pi->dx ? dx : int_min(pi->dx, dx);
				pi[pino].dy = !pi->dy ? dy : int_min(pi->dy, dy);
			}
		}

		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(tcp->numlayers * pi[pino].step_l, sizeof(short int));
			if(!pi[pino].include) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		/* Generation of boundaries for each prog flag*/
			if(tcp->POC && ( cp->cinema || ((!cp->cinema) && (t2_mode == FINAL_PASS)))){
				tcp->pocs[pino].compS= tcp->pocs[pino].compno0;
				tcp->pocs[pino].compE= tcp->pocs[pino].compno1;
				tcp->pocs[pino].resS = tcp->pocs[pino].resno0;
				tcp->pocs[pino].resE = tcp->pocs[pino].resno1;
				tcp->pocs[pino].layE = tcp->pocs[pino].layno1;
				tcp->pocs[pino].prg  = tcp->pocs[pino].prg1;
				if (pino > 0)
					tcp->pocs[pino].layS = (tcp->pocs[pino].layE > tcp->pocs[pino - 1].layE) ? tcp->pocs[pino - 1].layE : 0;
			}else {
				tcp->pocs[pino].compS= 0;
				tcp->pocs[pino].compE= image->numcomps;
				tcp->pocs[pino].resS = 0;
				tcp->pocs[pino].resE = maxres;
				tcp->pocs[pino].layS = 0;
				tcp->pocs[pino].layE = tcp->numlayers;
				tcp->pocs[pino].prg  = tcp->prg;
			}
			tcp->pocs[pino].prcS = 0;
			tcp->pocs[pino].prcE = maxprec;;
			tcp->pocs[pino].txS = pi[pino].tx0;
			tcp->pocs[pino].txE = pi[pino].tx1;
			tcp->pocs[pino].tyS = pi[pino].ty0;
			tcp->pocs[pino].tyE = pi[pino].ty1;
			tcp->pocs[pino].dx = pi[pino].dx;
			tcp->pocs[pino].dy = pi[pino].dy;
		}
			return pi;
	}